

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

IpEndpointName __thiscall
UdpSocket::Implementation::LocalEndpointFor(Implementation *this,IpEndpointName *remoteEndpoint)

{
  int iVar1;
  runtime_error *this_00;
  int *piVar2;
  IpEndpointName IVar3;
  socklen_t length;
  sockaddr_in sockAddr;
  sockaddr local_38;
  sockaddr_in connectSockAddr;
  
  if (this->isBound_ == false) {
    __assert_fail("isBound_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TheTechnobear[P]OscProxy/oscpack/ip/posix/UdpSocket.cpp"
                  ,0x94,
                  "IpEndpointName UdpSocket::Implementation::LocalEndpointFor(const IpEndpointName &) const"
                 );
  }
  SockaddrFromIpEndpointName(&connectSockAddr,remoteEndpoint);
  iVar1 = connect(this->socket_,(sockaddr *)&connectSockAddr,0x10);
  if (iVar1 < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to connect udp socket\n");
  }
  else {
    sockAddr.sin_family = 0;
    sockAddr.sin_port = 0;
    sockAddr.sin_addr.s_addr = 0;
    sockAddr.sin_zero[0] = '\0';
    sockAddr.sin_zero[1] = '\0';
    sockAddr.sin_zero[2] = '\0';
    sockAddr.sin_zero[3] = '\0';
    sockAddr.sin_zero[4] = '\0';
    sockAddr.sin_zero[5] = '\0';
    sockAddr.sin_zero[6] = '\0';
    sockAddr.sin_zero[7] = '\0';
    length = 0x10;
    iVar1 = getsockname(this->socket_,(sockaddr *)&sockAddr,&length);
    if (-1 < iVar1) {
      if (this->isConnected_ == true) {
        iVar1 = connect(this->socket_,(sockaddr *)&this->connectedAddr_,0x10);
        if (iVar1 < 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"unable to connect udp socket\n");
          goto LAB_00104468;
        }
      }
      else {
        local_38.sa_family = 0;
        local_38.sa_data[0] = '\0';
        local_38.sa_data[1] = '\0';
        local_38.sa_data[2] = '\0';
        local_38.sa_data[3] = '\0';
        local_38.sa_data[4] = '\0';
        local_38.sa_data[5] = '\0';
        local_38.sa_data[6] = '\0';
        local_38.sa_data[7] = '\0';
        local_38.sa_data[8] = '\0';
        local_38.sa_data[9] = '\0';
        local_38.sa_data[10] = '\0';
        local_38.sa_data[0xb] = '\0';
        local_38.sa_data[0xc] = '\0';
        local_38.sa_data[0xd] = '\0';
        iVar1 = connect(this->socket_,&local_38,0x10);
        if (iVar1 < 0) {
          piVar2 = __errno_location();
          if (*piVar2 != 0x61) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"unable to un-connect udp socket\n");
            goto LAB_00104468;
          }
        }
      }
      IVar3.address =
           (ulong)(-(uint)(sockAddr.sin_addr.s_addr == 0) |
                  sockAddr.sin_addr.s_addr >> 0x18 | (sockAddr.sin_addr.s_addr & 0xff0000) >> 8 |
                  (sockAddr.sin_addr.s_addr & 0xff00) << 8 | sockAddr.sin_addr.s_addr << 0x18);
      IVar3.port = -(uint)(sockAddr.sin_port == 0) |
                   (uint)(ushort)(sockAddr.sin_port << 8 | sockAddr.sin_port >> 8);
      IVar3._12_4_ = 0;
      return IVar3;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to getsockname\n");
  }
LAB_00104468:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

IpEndpointName LocalEndpointFor( const IpEndpointName& remoteEndpoint ) const
	{
		assert( isBound_ );

		// first connect the socket to the remote server
        
        struct sockaddr_in connectSockAddr;
		SockaddrFromIpEndpointName( connectSockAddr, remoteEndpoint );
       
        if (connect(socket_, (struct sockaddr *)&connectSockAddr, sizeof(connectSockAddr)) < 0) {
            throw std::runtime_error("unable to connect udp socket\n");
        }

        // get the address

        struct sockaddr_in sockAddr;
        std::memset( (char *)&sockAddr, 0, sizeof(sockAddr ) );
        socklen_t length = sizeof(sockAddr);
        if (getsockname(socket_, (struct sockaddr *)&sockAddr, &length) < 0) {
            throw std::runtime_error("unable to getsockname\n");
        }
        
		if( isConnected_ ){
			// reconnect to the connected address
			
			if (connect(socket_, (struct sockaddr *)&connectedAddr_, sizeof(connectedAddr_)) < 0) {
				throw std::runtime_error("unable to connect udp socket\n");
			}

		}else{
			// unconnect from the remote address
		
			struct sockaddr_in unconnectSockAddr;
			std::memset( (char *)&unconnectSockAddr, 0, sizeof(unconnectSockAddr ) );
			unconnectSockAddr.sin_family = AF_UNSPEC;
			// address fields are zero
			int connectResult = connect(socket_, (struct sockaddr *)&unconnectSockAddr, sizeof(unconnectSockAddr));
			if ( connectResult < 0 && errno != EAFNOSUPPORT ) {
				throw std::runtime_error("unable to un-connect udp socket\n");
			}
		}

		return IpEndpointNameFromSockaddr( sockAddr );
	}